

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O1

void __thiscall w3Interp::Invoke(w3Interp *this,w3Function *function)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  w3Code *pwVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  double dVar5;
  undefined1 auVar6 [16];
  w3Tag wVar7;
  w3InstructionEnum wVar8;
  pointer pwVar9;
  pointer pwVar10;
  pointer pwVar11;
  pointer pwVar12;
  pointer pwVar13;
  w3DecodedInstruction *pwVar14;
  w3DecodedInstruction *pwVar15;
  Value VVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined7 uVar19;
  long lVar20;
  w3Tag *pwVar21;
  Value *pVVar22;
  pointer pwVar23;
  int iVar24;
  int32_t iVar25;
  size_t sVar26;
  ulong uVar27;
  Value VVar28;
  size_t sVar29;
  char *pcVar30;
  w3Module *module;
  size_t sVar31;
  pointer pwVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  w3Module *pwVar36;
  uint32_t uVar37;
  float fVar38;
  uint uVar39;
  uint8_t *cursor;
  w3Frame frame_value;
  w3StackValue ret;
  double local_148;
  w3StackValue local_110;
  w3Code *local_e0;
  size_t local_d8;
  uint8_t *local_d0;
  w3Frame local_c8;
  w3StackValue local_60;
  
  uVar34 = function->function_type_index;
  module = this->module;
  pwVar9 = (module->function_types).
           super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar34 < (ulong)(((long)(module->function_types).
                              super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pwVar9 >> 4) *
                      -0x5555555555555555)) {
    pwVar2 = (module->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
             super__Vector_impl_data._M_start + function->function_index;
    pwVar10 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
              super__Vector_impl_data._M_start;
    pwVar11 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pwVar12 = *(pointer *)
               &pwVar9[uVar34].parameters.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl;
    pwVar13 = pwVar9[uVar34].parameters.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_d0 = pwVar2->cursor;
    if (local_d0 != (uint8_t *)0x0) {
      DecodeFunction(module,pwVar2,&local_d0);
      pwVar2->cursor = (uint8_t *)0x0;
    }
    lVar20 = (long)(pwVar2->decoded_instructions).
                   super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pwVar2->decoded_instructions).
                   super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar20 != 0) {
      sVar26 = (long)pwVar11 - (long)pwVar10;
      sVar29 = (long)pwVar13 - (long)pwVar12;
      this_00 = &this->super_w3Stack;
      w3Stack::DumpStack(this_00,"invoke1");
      local_c8.locals = 0;
      local_c8.module = this->module;
      local_c8.module_instance = this->module_instance;
      local_c8.function_index = function->function_index;
      local_d8 = sVar29 + sVar26;
      if (pwVar11 == pwVar10) {
        local_c8.local_only_types = (pointer)0x0;
      }
      else {
        local_c8.local_only_types =
             (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_c8.function_type = pwVar9 + uVar34;
      if (pwVar13 == pwVar12) {
        local_c8.param_types = (pointer)0x0;
      }
      else {
        local_c8.param_types =
             ((local_c8.function_type)->parameters).
             super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.super__Vector_impl_data.
             _M_start;
      }
      local_60.tag = Tag_Frame;
      local_60.value.tag = Tag_none;
      local_60.value._1_7_ = 0;
      local_60.value.value.u64 = 0;
      local_60.frame = (w3Frame *)0x0;
      local_60.label.arity = 0;
      local_60.label.continuation = 0;
      this->frame = &local_c8;
      local_e0 = pwVar2;
      local_c8.code = pwVar2;
      local_c8.param_count = sVar29;
      local_c8.local_only_count = sVar26;
      local_c8.param_and_local_count = local_d8;
      local_c8.interp = this;
      w3Stack::push_frame(this_00,&local_60);
      w3Stack::DumpStack(this_00,"pushed_frame");
      if (pwVar13 != pwVar12) {
        uVar34 = (long)pwVar12 * 0x30 + (long)pwVar13 * -0x30 | 8;
        sVar31 = 0;
        do {
          printf("2 entering function with param [%lX] type %X\n",sVar31,
                 (ulong)(&((this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                           super__Vector_impl_data._M_finish)->tag)[uVar34]);
          sVar31 = sVar31 + 1;
          uVar34 = uVar34 + 0x30;
        } while (sVar29 != sVar31);
      }
      if (pwVar13 != pwVar12) {
        lVar35 = sVar29 + (sVar29 == 0);
        lVar33 = -0x30;
        do {
          w3Stack::DumpStack(this_00,"moved_param_before");
          pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                    super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pwVar21 = &pwVar23[-1].tag + lVar33;
          uVar17 = *(undefined8 *)pwVar21;
          wVar7 = ((TaggedValue *)(pwVar21 + 8))->tag;
          uVar19 = *(undefined7 *)&((TaggedValue *)(pwVar21 + 8))->field_0x1;
          auVar6 = *(undefined1 (*) [16])((long)pwVar23 + lVar33 + -0x20);
          puVar3 = (undefined8 *)((long)pwVar23 + lVar33 + -0x10);
          uVar18 = puVar3[1];
          puVar4 = (undefined8 *)((long)&(pwVar23->label).arity + lVar33);
          *puVar4 = *puVar3;
          puVar4[1] = uVar18;
          *(undefined1 (*) [16])((long)&(pwVar23->value).value + lVar33) = auVar6;
          pwVar21 = &pwVar23->tag + lVar33;
          *(undefined8 *)pwVar21 = uVar17;
          ((TaggedValue *)(pwVar21 + 8))->tag = wVar7;
          *(undefined7 *)&((TaggedValue *)(pwVar21 + 8))->field_0x1 = uVar19;
          w3Stack::DumpStack(this_00,"moved_param_after");
          lVar33 = lVar33 + -0x30;
          lVar35 = lVar35 + -1;
        } while (lVar35 != 0);
      }
      (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_finish[-1 - sVar29].tag = Tag_Frame;
      w3Stack::DumpStack(this_00,"push_locals_before");
      pwVar2 = local_e0;
      if (pwVar11 != pwVar10) {
        sVar29 = 0;
        do {
          wVar7 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar29];
          local_110.frame = (w3Frame *)0x0;
          local_110.label.arity = 0;
          local_110.value._0_8_ = 0;
          local_110.value.value.u64 = 0;
          local_110.label.continuation = 0;
          local_110.tag = wVar7;
          if ((~wVar7 & 0x78) == 0) {
            local_110.tag = Tag_Value;
            local_110.value._1_7_ = 0;
            local_110.value.tag = wVar7;
          }
          w3Stack::push_value(this_00,&local_110);
          sVar29 = sVar29 + 1;
        } while (sVar26 != sVar29);
      }
      w3Stack::DumpStack(this_00,"push_locals_after");
      local_c8.locals =
           ((long)(this->stack->super_w3StackBase).super_w3StackBaseBase.
                  super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->stack->super_w3StackBase).super_w3StackBaseBase.
                  super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 - local_d8;
      if (local_d8 != 0) {
        lVar33 = 8;
        pwVar32 = (pointer)0x0;
        do {
          printf("2 entering function with local [%lX] type %X\n",pwVar32,
                 (ulong)(&((local_c8.interp)->stack->super_w3StackBase).super_w3StackBaseBase.
                          super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                          super__Vector_impl_data._M_start[local_c8.locals].tag)[lVar33]);
          pwVar32 = pwVar32 + 1;
          lVar33 = lVar33 + 0x30;
        } while (pwVar11 + (long)(pwVar13 + (-(long)pwVar10 - (long)pwVar12)) != pwVar32);
      }
      pwVar14 = (this->super_Wasm).instr;
      module = (w3Module *)
               (local_e0->decoded_instructions).
               super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this->super_Wasm).instr = (w3DecodedInstruction *)module;
      if (0 < lVar20) {
        pwVar36 = (w3Module *)(lVar20 + (long)module);
        do {
          if (module == (w3Module *)0x0) {
            Invoke();
            goto LAB_00119a6b;
          }
          switch(*(w3InstructionEnum *)&(module->name).field_2) {
          case Unreach:
            goto switchD_0011730d_caseD_0;
          case Nop:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Nop",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            break;
          case Block:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Block",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            local_110.tag = Tag_Label;
            local_110.frame = (w3Frame *)0x0;
            local_110.value._0_8_ = 0;
            local_110.value.value.u64 = 0;
            pwVar15 = (this->super_Wasm).instr;
            local_110.label.arity =
                 (size_t)((pwVar15->super_w3DecodedInstructionZeroInit).blockType != Tag_empty);
            local_110.label.continuation = (pwVar15->super_w3DecodedInstructionZeroInit).field_0.u64
            ;
            w3Stack::push_label(this_00,&local_110);
            break;
          case Loop:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Loop",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            local_110.tag = Tag_Label;
            local_110.frame = (w3Frame *)0x0;
            local_110.value._0_8_ = 0;
            local_110.value.value.u64 = 0;
            pwVar15 = (this->super_Wasm).instr;
            local_110.label.arity =
                 (size_t)((pwVar15->super_w3DecodedInstructionZeroInit).blockType != Tag_empty);
            local_110.label.continuation = (pwVar15->super_w3DecodedInstructionZeroInit).field_0.u64
            ;
            w3Stack::push_label(this_00,&local_110);
            (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
            super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].label.arity = 0;
            break;
          case If:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","If",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            If(this);
            break;
          case Else:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Else",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            BlockEnd(this);
            (this->super_Wasm).instr =
                 (this->frame->code->decoded_instructions).
                 super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 ((((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.field_8.
                  if_end - 1);
            break;
          case Reserved06:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved06";
            goto LAB_00119913;
          case Reserved07:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved07";
            goto LAB_00119913;
          case Reserved08:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved08";
            goto LAB_00119913;
          case Reserved09:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved09";
            goto LAB_00119913;
          case Reserved0A:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved0A";
            goto LAB_00119913;
          case BlockEnd:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","BlockEnd",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            BlockEnd(this);
            break;
          case Br:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Br",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Br(this);
            break;
          case BrIf:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","BrIf",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            BrIf(this);
            break;
          case BrTable:
switchD_0011730d_caseD_e:
            Invoke((w3Interp *)module);
            fprintf(_stderr,"AssertFailed:%s\n","!\"unreach\"");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3.cpp"
                          ,0x3d,"void AssertFailed(PCSTR)");
          case Ret:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ret",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ret(this);
            break;
          case Call:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Call",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Call(this);
            break;
          case Calli:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Calli",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Calli(this);
            break;
          case Reserved12:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved12";
            goto LAB_00119913;
          case Reserved13:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved13";
            goto LAB_00119913;
          case Reserved14:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved14";
            goto LAB_00119913;
          case Reserved15:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved15";
            goto LAB_00119913;
          case Reserved16:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved16";
            goto LAB_00119913;
          case Reserved17:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved17";
            goto LAB_00119913;
          case Reserved18:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved18";
            goto LAB_00119913;
          case Reserved19:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved19";
            goto LAB_00119913;
          case Drop:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Drop",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            goto LAB_001198f4;
          case Select:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Select",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Select(this);
            break;
          case Reserved1C:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved1C";
            goto LAB_00119913;
          case Reserved1D:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved1D";
            goto LAB_00119913;
          case Reserved1E:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved1E";
            goto LAB_00119913;
          case Reserved1F:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved1F";
            goto LAB_00119913;
          case Local_get:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Local_get",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Local_get(this);
            break;
          case Local_set:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Local_set",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Local_tee(this);
LAB_001198f4:
            w3Stack::AssertTopIsValue(this_00);
            ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                       super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppwVar1 = *ppwVar1 + -1;
            break;
          case Local_tee:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Local_tee",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Local_tee(this);
            break;
          case Global_get:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Global_get",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            Global_get(this);
            break;
          case Global_set:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Global_set",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            Global_set(this);
            break;
          case Reserved25:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved25";
            goto LAB_00119913;
          case Reserved26:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved26";
            goto LAB_00119913;
          case Reserved27:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "Reserved27";
            goto LAB_00119913;
          case i32_Load_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            i32_Load_(this);
            break;
          case i64_Load_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            i64_Load_(this);
            break;
          case f32_Load_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Load_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            f32_Load_(this);
            break;
          case f64_Load_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Load_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            f64_Load_(this);
            break;
          case i32_Load8s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load8s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Load8s(this);
            break;
          case i32_Load8u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load8u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Load8u(this);
            break;
          case i32_Load16s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load16s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Load16s(this);
            break;
          case i32_Load16u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load16u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Load16u(this);
            break;
          case i64_Load8s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load8s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Load8s(this);
            break;
          case i64_Load8u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load8u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Load8u(this);
            break;
          case i64_Load16s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load16s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Load16s(this);
            break;
          case i64_Load16u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load16u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Load16u(this);
            break;
          case i64_Load32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load32s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Load32s(this);
            break;
          case i64_Load32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load32u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Load32u(this);
            break;
          case i32_Store_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Store_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Store_(this);
            break;
          case i64_Store_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Store_(this);
            break;
          case f32_Store_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Store_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            f32_Store_(this);
            break;
          case f64_Store_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Store_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            f64_Store_(this);
            break;
          case i32_Store8:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Store8",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Store8(this);
            break;
          case i32_Store16:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Store16",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i32_Store16(this);
            break;
          case i64_Store8:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store8",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Store8(this);
            break;
          case i64_Store16:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store16",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Store16(this);
            break;
          case i64_Store32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store32",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            i64_Store32(this);
            break;
          case MemSize:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","MemSize",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            local_110.value._0_8_ = 0x7f;
            local_110.value.value.u64 =
                 (ulong)((long)(this->module_instance->memory).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->module_instance->memory).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 0x10 & 0xffffffff;
            goto LAB_001196e8;
          case MemGrow:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","MemGrow",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            MemGrow(this);
            break;
          case i32_Const:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Const",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            local_110.value._0_8_ = 0x7f;
            local_110.value.value.u64._4_4_ = 0;
            local_110.value.value.i32 =
                 (((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
            goto LAB_001196e8;
          case i64_Const:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Const",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            local_110.value.value = *(Value *)(this->super_Wasm).instr;
            local_110.value._0_8_ = 0x7e;
            goto LAB_001196e8;
          case f32_Const:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Const",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            local_110.value._0_8_ = 0x7d;
            local_110.value.value.u64._4_4_ = 0;
            local_110.value.value.i32 =
                 (((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
            goto LAB_001196e8;
          case f64_Const:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Const",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            local_110.value.value = *(Value *)(this->super_Wasm).instr;
            local_110.value._0_8_ = 0x7c;
LAB_001196e8:
            local_110.label.continuation = 0;
            local_110.label.arity = 0;
            local_110.frame = (w3Frame *)0x0;
            local_110.tag = Tag_Value;
            w3Stack::push_value(this_00,&local_110);
            break;
          case Eqz_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eqz_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Eqz_i32(this);
            break;
          case Eq_i32_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_i32_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Eq_i32_(this);
            break;
          case Ne_i32_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_i32_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ne_i32_(this);
            break;
          case Lt_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i32s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Lt_i32s(this);
            break;
          case Lt_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i32u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Lt_i32u(this);
            break;
          case Gt_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i32s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Gt_i32s(this);
            break;
          case Gt_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i32u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Gt_i32u(this);
            break;
          case Le_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i32s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Le_i32s(this);
            break;
          case Le_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i32u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Le_i32u(this);
            break;
          case Ge_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i32s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ge_i32s(this);
            break;
          case Ge_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i32u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ge_i32u(this);
            break;
          case Eqz_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eqz_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Eqz_i64(this);
            break;
          case Eq_i64_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_i64_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Eq_i64_(this);
            break;
          case Ne_i64_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_i64_",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ne_i64_(this);
            break;
          case Lt_i64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i64s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Lt_i64s(this);
            break;
          case Lt_i64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i64u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Lt_i64u(this);
            break;
          case Gt_i64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i64s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Gt_i64s(this);
            break;
          case Gt_i64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i64u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Gt_i64u(this);
            break;
          case Le_i64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i64s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Le_i64s(this);
            break;
          case Le_i64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i64u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Le_i64u(this);
            break;
          case Ge_i64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i64s",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ge_i64s(this);
            break;
          case Ge_i64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i64u",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ge_i64u(this);
            break;
          case Eq_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Eq_f32(this);
            break;
          case Ne_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ne_f32(this);
            break;
          case Lt_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Lt_f32(this);
            break;
          case Gt_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Gt_f32(this);
            break;
          case Le_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Le_f32(this);
            break;
          case Ge_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ge_f32(this);
            break;
          case Eq_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Eq_f64(this);
            break;
          case Ne_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ne_f64(this);
            break;
          case Lt_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Lt_f64(this);
            break;
          case Gt_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Gt_f64(this);
            break;
          case Le_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Le_f64(this);
            break;
          case Ge_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Ge_f64(this);
            break;
          case CountLeadingZeros_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            iVar25 = 0;
            printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i32",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            iVar24 = pVVar22->i32;
            if (-1 < iVar24) {
              iVar25 = 0;
              do {
                iVar25 = iVar25 + 1;
                iVar24 = iVar24 * 2;
              } while (-1 < iVar24);
            }
            pVVar22->i32 = iVar25;
            break;
          case CountTrailingZeros_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i32",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            CountTrailingZeros_i32(this);
            break;
          case CountSetBits_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i32",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            CountSetBits_i32(this);
            break;
          case Add_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Add_i32(this);
            break;
          case Sub_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Sub_i32(this);
            break;
          case Mul_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Mul_i32(this);
            break;
          case Div_s_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_s_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Div_s_i32(this);
            break;
          case Div_u_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_u_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Div_u_i32(this);
            break;
          case Rem_s_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_s_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Rem_s_i32(this);
            break;
          case Rem_u_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_u_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Rem_u_i32(this);
            break;
          case And_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","And_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            And_i32(this);
            break;
          case Or_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Or_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Or_i32(this);
            break;
          case Xor_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Xor_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Xor_i32(this);
            break;
          case Shl_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shl_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Shl_i32(this);
            break;
          case Shr_s_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_s_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Shr_s_i32(this);
            break;
          case Shr_u_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_u_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Shr_u_i32(this);
            break;
          case Rotl_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotl_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            Rotl_i32(this);
            break;
          case Rotr_i32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotr_i32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            Rotr_i32(this);
            break;
          case CountLeadingZeros_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            VVar28.u64 = 0;
            printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i64",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i64);
            lVar20 = pVVar22->i64;
            if (-1 < lVar20) {
              do {
                VVar28.i32 = VVar28.i32 + 1;
                VVar28.u64._4_4_ = 0;
                lVar20 = lVar20 * 2;
              } while (-1 < lVar20);
              VVar28.u64._4_4_ = 0;
            }
            *pVVar22 = VVar28;
            break;
          case CountTrailingZeros_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i64",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            CountTrailingZeros_i64(this);
            break;
          case CountSetBits_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i64",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            CountSetBits_i64(this);
            break;
          case Add_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Add_i64(this);
            break;
          case Sub_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Sub_i64(this);
            break;
          case Mul_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Mul_i64(this);
            break;
          case Div_s_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_s_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Div_s_i64(this);
            break;
          case Div_u_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_u_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Div_u_i64(this);
            break;
          case Rem_s_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_s_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Rem_s_i64(this);
            break;
          case Rem_u_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_u_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Rem_u_i64(this);
            break;
          case And_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","And_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            And_i64(this);
            break;
          case Or_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Or_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Or_i64(this);
            break;
          case Xor_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Xor_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Xor_i64(this);
            break;
          case Shl_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shl_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Shl_i64(this);
            break;
          case Shr_s_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_s_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Shr_s_i64(this);
            break;
          case Shr_u_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_u_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            Shr_u_i64(this);
            break;
          case Rotl_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotl_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            Rotl_i64(this);
            break;
          case Rotr_i64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotr_i64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            Rotr_i64(this);
            break;
          case Abs_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Abs_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            uVar37 = pVVar22->u32 & 0x7fffffff;
            goto LAB_00118d6d;
          case Neg_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Neg_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            uVar37 = pVVar22->u32 ^ 0x80000000;
LAB_00118d6d:
            pVVar22->u32 = uVar37;
            break;
          case Ceil_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ceil_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            fVar38 = ceilf(pVVar22->f32);
            goto LAB_001199f7;
          case Floor_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Floor_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            fVar38 = wasm_floorf(pVVar22->f32);
            goto LAB_001199f7;
          case Trunc_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Trunc_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            fVar38 = wasm_truncf(pVVar22->f32);
            goto LAB_001199f7;
          case Nearest_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Nearest_f32",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            fVar38 = wasm_roundf(pVVar22->f32);
            goto LAB_001199f7;
          case Sqrt_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sqrt_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            fVar38 = pVVar22->f32;
            if (fVar38 < 0.0) {
              fVar38 = sqrtf(fVar38);
            }
            else {
              fVar38 = SQRT(fVar38);
            }
LAB_001199f7:
            pVVar22->f32 = fVar38;
            break;
          case Add_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Add_f32(this);
            break;
          case Sub_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Sub_f32(this);
            break;
          case Mul_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Mul_f32(this);
            break;
          case Div_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Div_f32(this);
            break;
          case Min_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Min_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Min_f32(this);
            break;
          case Max_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Max_f32",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Max_f32(this);
            break;
          case Copysign_f32:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Copysign_f32",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            Copysign_f32(this);
            break;
          case Abs_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Abs_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            iVar25 = (*pVVar22).i32;
            uVar39 = (uint)((ulong)*pVVar22 >> 0x20) & 0x7fffffff;
            goto LAB_0011910f;
          case Neg_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Neg_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            iVar25 = (*pVVar22).i32;
            uVar39 = (uint)((ulong)*pVVar22 >> 0x20) ^ 0x80000000;
LAB_0011910f:
            VVar16.u64._4_4_ = uVar39;
            VVar16.i32 = iVar25;
            *pVVar22 = VVar16;
            break;
          case Ceil_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ceil_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            dVar5 = ceil(pVVar22->f64);
            goto LAB_00119a03;
          case Floor_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Floor_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            dVar5 = floor(pVVar22->f64);
            goto LAB_00119a03;
          case Trunc_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Trunc_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39
                  );
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            dVar5 = wasm_truncd(pVVar22->f64);
            goto LAB_00119a03;
          case Nearest_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Nearest_f64",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            dVar5 = wasm_roundd(pVVar22->f64);
            goto LAB_00119a03;
          case Sqrt_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sqrt_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39)
            ;
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            dVar5 = pVVar22->f64;
            if (dVar5 < 0.0) {
              dVar5 = sqrt(dVar5);
            }
            else {
              dVar5 = SQRT(dVar5);
            }
LAB_00119a03:
            pVVar22->f64 = dVar5;
            break;
          case Add_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Add_f64(this);
            break;
          case Sub_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Sub_f64(this);
            break;
          case Mul_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Mul_f64(this);
            break;
          case Div_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Div_f64(this);
            break;
          case Min_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Min_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Min_f64(this);
            break;
          case Max_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Max_f64",(ulong)uVar39,(ulong)uVar39,(ulong)uVar39);
            Max_f64(this);
            break;
          case Copysign_f64:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Copysign_f64",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            Copysign_f64(this);
            break;
          case i32_Wrap_i64_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Wrap_i64_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i64);
            iVar25 = pVVar22->i32;
            goto LAB_00118fbb;
          case i32_Trunc_f32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            iVar25 = (int32_t)pVVar22->f32;
            goto LAB_00118fbb;
          case i32_Trunc_f32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            iVar25 = (int32_t)(long)pVVar22->f32;
            goto LAB_00118bb3;
          case i32_Trunc_f64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            iVar25 = (int32_t)pVVar22->f64;
LAB_00118fbb:
            w3Stack::AssertTopIsValue(this_00);
            pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar23[-1].value.tag = Tag_i32;
            pwVar23[-1].value.value.i32 = iVar25;
            break;
          case i32_Trunc_f64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            iVar25 = (int32_t)(long)pVVar22->f64;
LAB_00118bb3:
            w3Stack::AssertTopIsValue(this_00);
            pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar23[-1].value.tag = Tag_i32;
            pwVar23[-1].value.value.i32 = iVar25;
            break;
          case i64_Extend_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            uVar34 = (ulong)pVVar22->i32;
            goto LAB_001190bd;
          case i64_Extend_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            uVar34 = (ulong)pVVar22->u32;
            goto LAB_001190bd;
          case i64_Trunc_f32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            uVar34 = (ulong)pVVar22->f32;
            goto LAB_001190bd;
          case i64_Trunc_f32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            uVar34 = (ulong)pVVar22->f32;
            uVar27 = (ulong)(pVVar22->f32 - 9.223372e+18);
            goto LAB_001190b7;
          case i64_Trunc_f64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            uVar34 = (ulong)pVVar22->f64;
            goto LAB_001190bd;
          case i64_Trunc_f64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            uVar34 = (ulong)pVVar22->f64;
            uVar27 = (ulong)(pVVar22->f64 - 9.223372036854776e+18);
LAB_001190b7:
            uVar34 = uVar27 & (long)uVar34 >> 0x3f | uVar34;
LAB_001190bd:
            w3Stack::AssertTopIsValue(this_00);
            pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar23[-1].value.tag = Tag_i64;
            pwVar23[-1].value.value.u64 = uVar34;
            break;
          case f32_Convert_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            uVar34 = (ulong)pVVar22->u32;
LAB_001181c5:
            fVar38 = (float)(long)uVar34;
            goto LAB_00119a2a;
          case f32_Convert_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            fVar38 = (float)pVVar22->i32;
            goto LAB_00119a2a;
          case f32_Convert_i64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i64);
            uVar34 = pVVar22->i64;
            if (-1 < (long)uVar34) goto LAB_001181c5;
            fVar38 = (float)uVar34;
            goto LAB_00119a2a;
          case f32_Convert_i64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i64);
            fVar38 = (float)pVVar22->i64;
            goto LAB_00119a2a;
          case f32_Demote_f64_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Demote_f64_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f64);
            fVar38 = (float)pVVar22->f64;
LAB_00119a2a:
            w3Stack::AssertTopIsValue(this_00);
            pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar23[-1].value.tag = Tag_f32;
            pwVar23[-1].value.value.f32 = fVar38;
            break;
          case f64_Convert_i32s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            local_148 = (double)pVVar22->i32;
            goto LAB_00119170;
          case f64_Convert_i32u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i32);
            local_148 = (double)pVVar22->u32;
            goto LAB_00119170;
          case f64_Convert_i64s:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64s",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i64);
            local_148 = (double)pVVar22->i64;
            goto LAB_00119170;
          case f64_Convert_i64u:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64u",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_i64);
            local_148 = ((double)CONCAT44(0x45300000,(int)((ulong)*pVVar22 >> 0x20)) -
                        1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(*pVVar22).i32) - 4503599627370496.0);
            w3Stack::AssertTopIsValue(this_00);
            pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar23[-1].value.tag = Tag_f64;
            goto LAB_0011918c;
          case f64_Promote_f32_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Promote_f32_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pVVar22 = w3Stack::value(this_00,Tag_f32);
            local_148 = (double)pVVar22->f32;
LAB_00119170:
            w3Stack::AssertTopIsValue(this_00);
            pwVar23 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar23[-1].value.tag = Tag_f64;
LAB_0011918c:
            pwVar23[-1].value.value.f64 = local_148;
            break;
          case i32_Reinterpret_f32_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Reinterpret_f32_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pwVar21 = w3Stack::tag(this_00,Tag_f32);
            *pwVar21 = Tag_i32;
            break;
          case i64_Reinterpret_f64_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Reinterpret_f64_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pwVar21 = w3Stack::tag(this_00,Tag_f64);
            *pwVar21 = Tag_i64;
            break;
          case f32_Reinterpret_i32_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Reinterpret_i32_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pwVar21 = w3Stack::tag(this_00,Tag_i32);
            *pwVar21 = Tag_f32;
            break;
          case f64_Reinterpret_i64_:
            uVar39 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Reinterpret_i64_",(ulong)uVar39,(ulong)uVar39,
                   (ulong)uVar39);
            pwVar21 = w3Stack::tag(this_00,Tag_i64);
            *pwVar21 = Tag_f64;
            break;
          case ReservedC0:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC0";
            goto LAB_00119913;
          case ReservedC1:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC1";
            goto LAB_00119913;
          case ReservedC2:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC2";
            goto LAB_00119913;
          case ReservedC3:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC3";
            goto LAB_00119913;
          case ReservedC4:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC4";
            goto LAB_00119913;
          case ReservedC5:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC5";
            goto LAB_00119913;
          case ReservedC6:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC6";
            goto LAB_00119913;
          case ReservedC7:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC7";
            goto LAB_00119913;
          case ReservedC8:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC8";
            goto LAB_00119913;
          case ReservedC9:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedC9";
            goto LAB_00119913;
          case ReservedCA:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedCA";
            goto LAB_00119913;
          case ReservedCB:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedCB";
            goto LAB_00119913;
          case ReservedCC:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedCC";
            goto LAB_00119913;
          case ReservedCD:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedCD";
            goto LAB_00119913;
          case ReservedCE:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedCE";
            goto LAB_00119913;
          case ReservedCF:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedCF";
            goto LAB_00119913;
          case ReservedD0:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD0";
            goto LAB_00119913;
          case ReservedD1:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD1";
            goto LAB_00119913;
          case ReservedD2:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD2";
            goto LAB_00119913;
          case ReservedD3:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD3";
            goto LAB_00119913;
          case ReservedD4:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD4";
            goto LAB_00119913;
          case ReservedD5:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD5";
            goto LAB_00119913;
          case ReservedD6:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD6";
            goto LAB_00119913;
          case ReservedD7:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD7";
            goto LAB_00119913;
          case ReservedD8:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD8";
            goto LAB_00119913;
          case ReservedD9:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedD9";
            goto LAB_00119913;
          case ReservedDA:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedDA";
            goto LAB_00119913;
          case ReservedDB:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedDB";
            goto LAB_00119913;
          case ReservedDC:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedDC";
            goto LAB_00119913;
          case ReservedDD:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedDD";
            goto LAB_00119913;
          case ReservedDE:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedDE";
            goto LAB_00119913;
          case ReservedDF:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedDF";
            goto LAB_00119913;
          case ReservedE0:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE0";
            goto LAB_00119913;
          case ReservedE1:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE1";
            goto LAB_00119913;
          case ReservedE2:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE2";
            goto LAB_00119913;
          case ReservedE3:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE3";
            goto LAB_00119913;
          case ReservedE4:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE4";
            goto LAB_00119913;
          case ReservedE5:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE5";
            goto LAB_00119913;
          case ReservedE6:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE6";
            goto LAB_00119913;
          case ReservedE7:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE7";
            goto LAB_00119913;
          case ReservedE8:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE8";
            goto LAB_00119913;
          case ReservedE9:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedE9";
            goto LAB_00119913;
          case ReservedEA:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedEA";
            goto LAB_00119913;
          case ReservedEB:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedEB";
            goto LAB_00119913;
          case ReservedEC:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedEC";
            goto LAB_00119913;
          case ReservedED:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedED";
            goto LAB_00119913;
          case ReservedEE:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedEE";
            goto LAB_00119913;
          case ReservedEF:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedEF";
            goto LAB_00119913;
          case ReservedF0:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF0";
            goto LAB_00119913;
          case ReservedF1:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF1";
            goto LAB_00119913;
          case ReservedF2:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF2";
            goto LAB_00119913;
          case ReservedF3:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF3";
            goto LAB_00119913;
          case ReservedF4:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF4";
            goto LAB_00119913;
          case ReservedF5:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF5";
            goto LAB_00119913;
          case ReservedF6:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF6";
            goto LAB_00119913;
          case ReservedF7:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF7";
            goto LAB_00119913;
          case ReservedF8:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF8";
            goto LAB_00119913;
          case ReservedF9:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedF9";
            goto LAB_00119913;
          case ReservedFA:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedFA";
            goto LAB_00119913;
          case ReservedFB:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedFB";
            goto LAB_00119913;
          case ReservedFC:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedFC";
            goto LAB_00119913;
          case ReservedFD:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedFD";
            goto LAB_00119913;
          case ReservedFE:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedFE";
            goto LAB_00119913;
          case ReservedFF:
            uVar34 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar30 = "ReservedFF";
LAB_00119913:
            printf("interp%s x:%X u:%u i:%i\n",pcVar30,uVar34,uVar34,uVar34);
            (*(this->super_Wasm)._vptr_Wasm[2])(this);
            (*(this->super_Wasm)._vptr_Wasm[2])(this);
          }
          pwVar15 = (this->super_Wasm).instr;
          wVar8 = (pwVar15->super_w3DecodedInstructionZeroInit).name;
          if (wVar8 - Call < 2) {
            this->frame = &local_c8;
          }
          else if (wVar8 == Ret) break;
          module = (w3Module *)(pwVar15 + 1);
          (this->super_Wasm).instr = (w3DecodedInstruction *)module;
        } while (module < pwVar36);
      }
      (this->super_Wasm).instr = pwVar14;
      return;
    }
  }
  else {
LAB_00119a6b:
    Invoke();
  }
  Invoke();
switchD_0011730d_caseD_0:
  Invoke((w3Interp *)module);
  goto switchD_0011730d_caseD_e;
}

Assistant:

void w3Interp::Invoke (w3Function& function)
{
    //__debugbreak ();
    // Decode function upon first call.
    // TODO thread safety
    // TODO merge with calli (invoke)

    const size_t function_type_index = function.function_type_index;
    Assert (function_type_index < module->function_types.size ());
    w3FunctionType* function_type = &module->function_types [function_type_index];
    w3Code* code = &module->code [function.function_index];
    const size_t local_only_count = code->locals.size ();
    const size_t param_count = function_type->parameters.size ();

    uint8_t* cursor = code->cursor;
    if (cursor)
    {
        DecodeFunction (module, code, &cursor);
        code->cursor = 0;
    }
    const size_t size = code->decoded_instructions.size ();
    Assert (size);

    DumpStack ("invoke1");

    // TODO cross-module calls
    // TODO calling embedding
    // setup frame
    w3Frame frame_value;
    frame_value.interp = this;
    frame_value.code = code;
    frame_value.module = this->module; // TODO cross module calls
    frame_value.module_instance = this->module_instance; // TODO cross module calls
    frame_value.function_index = function.function_index;
    frame_value.param_count = param_count;
    frame_value.param_and_local_count = local_only_count + param_count; // TODO overflow
    frame_value.local_only_count = local_only_count;
    frame_value.local_only_types = local_only_count ? &code->locals [0] : 0;
    frame_value.param_types = param_count ? &function_type->parameters [0] : 0;
    frame_value.function_type = function_type;

    w3StackValue ret (frame);
    this->frame = &frame_value;
    push_frame (ret);
    DumpStack ("pushed_frame");

    size_t i = 0;
    size_t j = 0;

    for (j = 0; j != param_count; ++j)
    {
        printf ("2 entering function with param [%" FORMAT_SIZE "X] type %X\n", j, (end () - (ssize_t)param_count + (ssize_t)j)->value.tag);
    }

    // CONSIDER put the interp loop elsewhere
    // Invoke would adjust member data and return to it

    // params are subsumed into new frame

    // TODO We really want this to be more efficient.
    // Either by having split stacks, or by computing
    // maximum parameter count and putting return before it.

    // For now live with memcpy or slower (stack is not presently contiguous)..

    if (param_count)
    {
        for (i = 0; i < param_count; ++i)
        {
            DumpStack ("moved_param_before");
            *(end () - 1 - (ssize_t)i) = *(end () - 2 - (ssize_t)i);
            DumpStack ("moved_param_after");
        }
    }

    // place return frame/address (frame is just a marker now, the data is on the native stack)

    (end () - 1 - (ssize_t)param_count)->tag = Tag_Frame;
    //(end () - 1 - param_count)->frame = frame;
    //(end () - 1 - param_count)->instr = instr + !!instr;

    // Push locals on stack.
    // TODO params also
    // TODO reserve (size () + local_only_count);
    DumpStack ("push_locals_before");
    for (i = 0; i != local_only_count; ++i)
        push_value (w3StackValue (code->locals [i]));

    DumpStack ("push_locals_after");
    // Provide for indexing locals.
    frame_value.locals = stack.size () - local_only_count - param_count;

    for (j = 0; j != local_only_count + param_count; ++j)
        printf ("2 entering function with local [%" FORMAT_SIZE "X] type %X\n", j, frame_value.Local (j).value.tag);

    //DumpStack ("invoke2");

    // TODO provide for separate depth -- i.e. here is now 0; locals/params cannot be popped

    w3DecodedInstruction* previous = instr; // call/ret handling
    instr = &code->decoded_instructions [0];
    w3DecodedInstruction* end = instr + size;
    for (; instr < end; ++instr) // Br subtracts one so this works.
    {
        Assert (instr);
        switch (instr->name)
        {
            // break before instead of after to avoid unreachable code warning
#undef RESERVED
#define RESERVED(b0) INSTRUCTION (0x ## b0, 0, 0, Reserved ## b0, Imm_none, 0, 0, Tag_none, Tag_none, Tag_none, Tag_none) { Reserved (); }

#undef INSTRUCTION
#define INSTRUCTION(byte0, fixed_size, byte1, name, imm, pop, push, in0, in1, in2, out0)     \
            break;                                                                           \
            case ::name:                                                                   \
            printf ("interp%s x:%X u:%u i:%i\n", #name, instr->u32, instr->u32, instr->u32); \
            this->name ();
#include "w3Instructions.h"
        }
        // special handling
        if (instr->name == ::Ret) // gross but most choices are
            break;
#include "diag-switch-push.h"
        switch (instr->name)
        {
        case ::Call:
        case ::Calli:
            frame = &frame_value; // TODO should handled in Ret.
            break;
        }
#include "diag-switch-pop.h"
    }
    instr = previous;
    // TODO handle ret
    //__debugbreak ();
}